

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::SPxMainSM<double>::simplify
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,Real remainingTime,bool keepbounds,
          uint32_t seed)

{
  DataArray<int> *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  Tolerances *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int *piVar5;
  char cVar6;
  Result RVar7;
  double *pdVar8;
  SPxOut *pSVar9;
  undefined7 in_register_00000011;
  long lVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  Real RVar14;
  bool again;
  Verbosity old_verbosity;
  bool local_99;
  Verbosity local_98 [3];
  int local_8c;
  double local_88;
  undefined8 uStack_80;
  int local_6c;
  Real local_68;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  (this->super_SPxSimplifier<double>).spxout = lp->spxout;
  this->m_thesense = lp->thesense;
  (*((this->super_SPxSimplifier<double>).m_timeUsed)->_vptr_Timer[2])(remainingTime);
  (*((this->super_SPxSimplifier<double>).m_timeUsed)->_vptr_Timer[3])();
  (this->super_SPxSimplifier<double>).m_objoffset = 0.0;
  ::soplex::infinity::__tls_init();
  pdVar8 = (double *)__tls_get_addr(&PTR_003b6b60);
  local_48 = *pdVar8;
  uStack_40 = 0;
  local_58 = -local_48;
  uStack_50 = 0x8000000000000000;
  this->m_cutoffbound = local_58;
  ::soplex::infinity::__tls_init();
  this->m_pseudoobj = local_58;
  this->m_result = OKAY;
  (this->super_SPxSimplifier<double>).m_remRows = 0;
  (this->super_SPxSimplifier<double>).m_remCols = 0;
  (this->super_SPxSimplifier<double>).m_remNzos = 0;
  (this->super_SPxSimplifier<double>).m_chgBnds = 0;
  (this->super_SPxSimplifier<double>).m_chgBnds = 0;
  (this->super_SPxSimplifier<double>).m_chgLRhs = 0;
  (this->super_SPxSimplifier<double>).m_keptBnds = 0;
  (this->super_SPxSimplifier<double>).m_keptLRhs = 0;
  local_99 = true;
  if (0 < (int)((ulong)((long)(this->m_hist).data.
                              super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_hist).data.
                             super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    std::
    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
    ::clear(&(this->m_hist).data);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::resize(&(this->m_hist).data,0);
  this->m_postsolved = false;
  pSVar9 = (this->super_SPxSimplifier<double>).spxout;
  local_8c = (int)CONCAT71(in_register_00000011,keepbounds);
  if ((pSVar9 != (SPxOut *)0x0) && (3 < (int)pSVar9->m_verbosity)) {
    local_98[1] = 4;
    local_98[0] = pSVar9->m_verbosity;
    (*pSVar9->_vptr_SPxOut[2])();
    iVar12 = 0;
    local_98[2] = 0;
    local_6c = 0;
    if (0 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
      lVar11 = 0;
      local_6c = 0;
      local_98[2] = 0;
      do {
        local_88 = (lp->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
        ::soplex::infinity::__tls_init();
        if (local_58 < local_88) {
          local_88 = (lp->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11];
          ::soplex::infinity::__tls_init();
          if (local_88 < local_48) {
            local_88 = (lp->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar11];
            uStack_80 = 0;
            local_60 = (lp->super_LPRowSetBase<double>).right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar11];
            pTVar3 = (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var4 = (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              }
            }
            RVar14 = Tolerances::epsilon(pTVar3);
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_68 = RVar14;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
              RVar14 = local_68;
            }
            if (ABS(local_88 - local_60) <= RVar14) {
              local_6c = local_6c + 1;
            }
            else {
              local_98[2] = local_98[2] + 1;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    }
    keepbounds = SUB41(local_8c,0);
    if (0 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
      lVar11 = 0;
      iVar12 = 0;
      do {
        local_88 = (lp->super_LPColSetBase<double>).low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
        ::soplex::infinity::__tls_init();
        if (local_58 < local_88) {
          local_88 = (lp->super_LPColSetBase<double>).up.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11];
          ::soplex::infinity::__tls_init();
          if (local_88 < local_48) {
            iVar12 = iVar12 + 1;
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    }
    pSVar9 = (this->super_SPxSimplifier<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar9->m_streams[pSVar9->m_verbosity],"LP has ",7);
    std::ostream::operator<<((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],local_6c);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar9->m_streams[pSVar9->m_verbosity]," equations, ",0xc);
    std::ostream::operator<<((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],local_98[2]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar9->m_streams[pSVar9->m_verbosity]," ranged rows, ",0xe);
    std::ostream::operator<<((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],iVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar9->m_streams[pSVar9->m_verbosity]," boxed columns",0xe);
    cVar6 = (char)pSVar9->m_streams[pSVar9->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18) +
                    cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    pSVar9 = (this->super_SPxSimplifier<double>).spxout;
    (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98);
  }
  this_00 = &this->m_stat;
  if ((this->m_stat).themax < 0x11) {
    DataArray<int>::reMax(this_00,(int)((this->m_stat).memFactor * 17.0),0x11);
  }
  else {
    this_00->thesize = 0x11;
  }
  if (0 < this_00->thesize) {
    piVar5 = (this->m_stat).data;
    lVar11 = 0;
    do {
      piVar5[lVar11] = 0;
      lVar11 = lVar11 + 1;
    } while (lVar11 < this_00->thesize);
  }
  this->m_addedcols = 0;
  handleRowObjectives(this,lp);
  VectorBase<double>::reDim
            (&this->m_prim,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,true)
  ;
  VectorBase<double>::reDim
            (&this->m_slack,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,true
            );
  VectorBase<double>::reDim
            (&this->m_dual,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,true)
  ;
  VectorBase<double>::reDim
            (&this->m_redCost,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,
             true);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            (&this->m_cBasisStat,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum
            );
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            (&this->m_rBasisStat,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum
            );
  DataArray<int>::reSize
            (&this->m_cIdx,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  DataArray<int>::reSize
            (&this->m_rIdx,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::vector<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>::resize
            (&(this->m_classSetRows).data,
             (long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::vector<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>::resize
            (&(this->m_classSetCols).data,
             (long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::vector<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>::resize
            (&(this->m_dupRows).data,
             (long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::vector<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>::resize
            (&(this->m_dupCols).data,
             (long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  this->m_keepbounds = keepbounds;
  if (0 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
    piVar5 = (this->m_rIdx).data;
    lVar11 = 0;
    do {
      piVar5[lVar11] = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  if (0 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    piVar5 = (this->m_cIdx).data;
    lVar11 = 0;
    do {
      piVar5[lVar11] = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  handleExtremes(this,lp);
  bVar13 = this->m_result == OKAY;
  if ((local_99 & bVar13) == 1) {
    iVar12 = 1;
    do {
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      if ((pSVar9 != (SPxOut *)0x0) && (4 < (int)pSVar9->m_verbosity)) {
        local_98[1] = 5;
        local_98[0] = pSVar9->m_verbosity;
        (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98 + 1);
        pSVar9 = (this->super_SPxSimplifier<double>).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar9->m_streams[pSVar9->m_verbosity],"Round ",6);
        std::ostream::operator<<((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],iVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar9->m_streams[pSVar9->m_verbosity],":",1);
        cVar6 = (char)pSVar9->m_streams[pSVar9->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        pSVar9 = (this->super_SPxSimplifier<double>).spxout;
        (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98);
      }
      local_99 = false;
      if (this->m_result == OKAY) {
        RVar7 = simplifyRows(this,lp,&local_99);
        this->m_result = RVar7;
      }
      if (this->m_result == OKAY) {
        RVar7 = simplifyCols(this,lp,&local_99);
        this->m_result = RVar7;
      }
      if (local_99 == false) {
        if (this->m_result == OKAY) {
          RVar7 = simplifyDual(this,lp,&local_99);
          this->m_result = RVar7;
        }
        if (local_99 == false) {
          if (this->m_result == OKAY) {
            RVar7 = duplicateRows(this,lp,&local_99);
            this->m_result = RVar7;
          }
          if (this->m_result == OKAY) {
            RVar7 = duplicateCols(this,lp,&local_99);
            this->m_result = RVar7;
          }
          if (local_99 == false) {
            trivialHeuristic(this,lp);
            propagatePseudoobj(this,lp);
            if (this->m_result == OKAY) {
              RVar7 = multiaggregation(this,lp,&local_99);
              this->m_result = RVar7;
            }
          }
        }
      }
      bVar13 = this->m_result == OKAY;
    } while ((local_99 == true) && (iVar12 = iVar12 + 1, this->m_result == OKAY));
  }
  if (bVar13) {
    iVar12 = this->m_addedcols;
    uVar1 = (this->super_SPxSimplifier<double>).m_remCols;
    uVar2 = (this->super_SPxSimplifier<double>).m_remNzos;
    (this->super_SPxSimplifier<double>).m_remCols = uVar1 - iVar12;
    (this->super_SPxSimplifier<double>).m_remNzos = uVar2 - iVar12;
    pSVar9 = (this->super_SPxSimplifier<double>).spxout;
    if ((pSVar9 != (SPxOut *)0x0) && (2 < (int)pSVar9->m_verbosity)) {
      local_98[1] = 3;
      local_98[0] = pSVar9->m_verbosity;
      (*pSVar9->_vptr_SPxOut[2])();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity],"Simplifier removed ",0x13);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],
                 (this->super_SPxSimplifier<double>).m_remRows);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," rows, ",7);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],
                 (this->super_SPxSimplifier<double>).m_remCols);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," columns, ",10);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],
                 (this->super_SPxSimplifier<double>).m_remNzos);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," nonzeros, ",0xb);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],
                 (this->super_SPxSimplifier<double>).m_chgBnds);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," col bounds, ",0xd);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],
                 (this->super_SPxSimplifier<double>).m_chgLRhs);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," row bounds",0xb);
      cVar6 = (char)pSVar9->m_streams[pSVar9->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18)
                      + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98);
    }
    if ((((char)local_8c != '\0') &&
        (pSVar9 = (this->super_SPxSimplifier<double>).spxout, pSVar9 != (SPxOut *)0x0)) &&
       (3 < (int)pSVar9->m_verbosity)) {
      local_98[1] = 4;
      local_98[0] = pSVar9->m_verbosity;
      (*pSVar9->_vptr_SPxOut[2])();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity],"Simplifier kept ",0x10);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],
                 (this->super_SPxSimplifier<double>).m_keptBnds);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," column bounds, ",0x10);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],
                 (this->super_SPxSimplifier<double>).m_keptLRhs);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," row bounds",0xb);
      cVar6 = (char)pSVar9->m_streams[pSVar9->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18)
                      + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98);
    }
    pSVar9 = (this->super_SPxSimplifier<double>).spxout;
    if ((pSVar9 != (SPxOut *)0x0) && (2 < (int)pSVar9->m_verbosity)) {
      local_98[1] = 3;
      local_98[0] = pSVar9->m_verbosity;
      (*pSVar9->_vptr_SPxOut[2])();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity],"Reduced LP has ",0xf);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],
                 (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," rows ",6);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],
                 (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," columns ",9);
      lVar11 = (long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      if (lVar11 < 1) {
        iVar12 = 0;
      }
      else {
        lVar10 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
                            [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                             [lVar10].idx].data.super_SVectorBase<double>.memused;
          lVar10 = lVar10 + 1;
        } while (lVar11 != lVar10);
      }
      std::ostream::operator<<((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],iVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," nonzeros",9);
      cVar6 = (char)pSVar9->m_streams[pSVar9->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18)
                      + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98);
    }
    pSVar9 = (this->super_SPxSimplifier<double>).spxout;
    if ((pSVar9 != (SPxOut *)0x0) && (3 < (int)pSVar9->m_verbosity)) {
      local_98[1] = 4;
      local_98[0] = pSVar9->m_verbosity;
      (*pSVar9->_vptr_SPxOut[2])();
      iVar12 = 0;
      local_8c = 0;
      local_98[2] = 0;
      if (0 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar11 = 0;
        local_98[2] = 0;
        local_8c = 0;
        do {
          local_88 = (lp->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11];
          ::soplex::infinity::__tls_init();
          if (local_58 < local_88) {
            local_88 = (lp->super_LPRowSetBase<double>).right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar11];
            ::soplex::infinity::__tls_init();
            if (local_88 < local_48) {
              local_88 = (lp->super_LPRowSetBase<double>).left.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
              uStack_80 = 0;
              local_60 = (lp->super_LPRowSetBase<double>).right.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
              pTVar3 = (this->super_SPxSimplifier<double>)._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var4 = (this->super_SPxSimplifier<double>)._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                }
              }
              RVar14 = Tolerances::epsilon(pTVar3);
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_68 = RVar14;
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                RVar14 = local_68;
              }
              if (ABS(local_88 - local_60) <= RVar14) {
                local_98[2] = local_98[2] + 1;
              }
              else {
                local_8c = local_8c + 1;
              }
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      if (0 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar11 = 0;
        iVar12 = 0;
        do {
          local_88 = (lp->super_LPColSetBase<double>).low.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11];
          ::soplex::infinity::__tls_init();
          if (local_58 < local_88) {
            local_88 = (lp->super_LPColSetBase<double>).up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar11];
            ::soplex::infinity::__tls_init();
            if (local_88 < local_48) {
              iVar12 = iVar12 + 1;
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity],"Reduced LP has ",0xf);
      std::ostream::operator<<((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],local_98[2]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," equations, ",0xc);
      std::ostream::operator<<((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],local_8c);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," ranged rows, ",0xe);
      std::ostream::operator<<((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],iVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," boxed columns",0xe);
      cVar6 = (char)pSVar9->m_streams[pSVar9->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18)
                      + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98);
    }
    if ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum == 0 &&
        (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum == 0) {
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      if ((pSVar9 != (SPxOut *)0x0) && (2 < (int)pSVar9->m_verbosity)) {
        local_98[1] = 3;
        local_98[0] = pSVar9->m_verbosity;
        (*pSVar9->_vptr_SPxOut[2])();
        pSVar9 = operator<<((this->super_SPxSimplifier<double>).spxout,
                            "Simplifier removed all rows and columns");
        std::endl<char,std::char_traits<char>>(pSVar9->m_streams[pSVar9->m_verbosity]);
        pSVar9 = (this->super_SPxSimplifier<double>).spxout;
        (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98);
      }
      this->m_result = VANISHED;
    }
    pSVar9 = (this->super_SPxSimplifier<double>).spxout;
    if ((pSVar9 != (SPxOut *)0x0) && (3 < (int)pSVar9->m_verbosity)) {
      local_98[1] = 4;
      local_98[0] = pSVar9->m_verbosity;
      (*pSVar9->_vptr_SPxOut[2])();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity],"\nSimplifier performed:\n",0x17);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],*(this->m_stat).data);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," empty rows\n",0xc);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," free rows\n",0xb);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[2]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," singleton rows\n",0x10);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[3]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," forcing rows\n",0xe);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[4]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," empty columns\n",0xf);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[5]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," fixed columns\n",0xf);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[6]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," free columns with zero objective\n",0x22);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[7]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," singleton columns with zero objective\n",
                 0x27);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[8]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity],
                 " singleton columns combined with a doubleton equation\n",0x36);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[9]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," free singleton columns\n",0x18);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[10]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," dominated columns\n",0x13);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[0xb]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," weakly dominated columns\n",0x1a);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[0xc]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," duplicate rows\n",0x10);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[0xd]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," duplicate columns (fixed)\n",0x1b);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[0xe]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," duplicate columns (substituted)\n",0x21);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[0xf]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," variable aggregations\n",0x17);
      std::ostream::operator<<
                ((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],(this->m_stat).data[0x10]);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity]," multi aggregations\n",0x14);
      cVar6 = (char)pSVar9->m_streams[pSVar9->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18)
                      + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98);
    }
    (*((this->super_SPxSimplifier<double>).m_timeUsed)->_vptr_Timer[4])();
  }
  else {
    pSVar9 = (this->super_SPxSimplifier<double>).spxout;
    if ((pSVar9 != (SPxOut *)0x0) && (local_98[0] = pSVar9->m_verbosity, 2 < (int)local_98[0])) {
      local_98[1] = 3;
      (*pSVar9->_vptr_SPxOut[2])();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity],"Simplifier result: ",0x13);
      std::ostream::operator<<((ostream *)pSVar9->m_streams[pSVar9->m_verbosity],this->m_result);
      cVar6 = (char)pSVar9->m_streams[pSVar9->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18)
                      + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar9->_vptr_SPxOut[2])(pSVar9,local_98);
    }
  }
  return this->m_result;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplify(SPxLPBase<R>& lp, Real remainingTime,
      bool keepbounds, uint32_t seed)
{
   // transfer message handler
   this->spxout = lp.spxout;
   assert(this->spxout != nullptr);

   m_thesense = lp.spxSense();
   this->m_timeUsed->reset();
   this->m_timeUsed->start();

   this->m_objoffset = 0.0;
   m_cutoffbound = R(-infinity);
   m_pseudoobj = R(-infinity);

   this->m_remRows = 0;
   this->m_remCols = 0;
   this->m_remNzos = 0;
   this->m_chgBnds = 0;
   this->m_chgLRhs = 0;
   this->m_keptBnds = 0;
   this->m_keptLRhs = 0;

   m_result     = this->OKAY;
   bool   again = true;
   int nrounds = 0;

   if(m_hist.size() > 0)
   {
      m_hist.clear();
   }

   m_hist.reSize(0);
   m_postsolved = false;

   SPX_MSG_INFO2((*this->spxout),
                 int numRangedRows = 0;
                 int numBoxedCols = 0;
                 int numEqualities = 0;

                 for(int i = 0; i < lp.nRows(); ++i)
{
   if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
      {
         if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
            ++numEqualities;
         else
            ++numRangedRows;
      }
   }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         m_stat.reSize(17);

   for(int k = 0; k < m_stat.size(); ++k)
      m_stat[k] = 0;

   m_addedcols = 0;
   handleRowObjectives(lp);

   m_prim.reDim(lp.nCols());
   m_slack.reDim(lp.nRows());
   m_dual.reDim(lp.nRows());
   m_redCost.reDim(lp.nCols());
   m_cBasisStat.reSize(lp.nCols());
   m_rBasisStat.reSize(lp.nRows());
   m_cIdx.reSize(lp.nCols());
   m_rIdx.reSize(lp.nRows());

   m_classSetRows.reSize(lp.nRows());
   m_classSetCols.reSize(lp.nCols());
   m_dupRows.reSize(lp.nRows());
   m_dupCols.reSize(lp.nCols());

   m_keepbounds = keepbounds;

   for(int i = 0; i < lp.nRows(); ++i)
      m_rIdx[i] = i;

   for(int j = 0; j < lp.nCols(); ++j)
      m_cIdx[j] = j;

   // round extreme values (set all values smaller than this->eps to zero and all values bigger than R(infinity)/5 to R(infinity))
#if SOPLEX_EXTREMES
   handleExtremes(lp);
#endif

   // main presolving loop
   while(again && m_result == this->OKAY)
   {
      nrounds++;
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Round " << nrounds << ":" << std::endl;)
      again = false;

#if SOPLEX_ROWS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyRows(lp, again);

#endif

#if SOPLEX_COLS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyCols(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUAL_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyDual(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUPLICATE_ROWS

      if(m_result == this->OKAY)
         m_result = duplicateRows(lp, again);

#endif

#if SOPLEX_DUPLICATE_COLS

      if(m_result == this->OKAY)
         m_result = duplicateCols(lp, again);

#endif

      if(!again)
      {
#if SOPLEX_TRIVIAL_HEURISTICS
         trivialHeuristic(lp);
#endif

#if SOPLEX_PSEUDOOBJ
         propagatePseudoobj(lp);
#endif

#if SOPLEX_MULTI_AGGREGATE

         if(m_result == this->OKAY)
            m_result = multiaggregation(lp, again);

#endif
      }

   }

   // preprocessing detected infeasibility or unboundedness
   if(m_result != this->OKAY)
   {
      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier result: " << static_cast<int>
                    (m_result) << std::endl;)
      return m_result;
   }

   this->m_remCols -= m_addedcols;
   this->m_remNzos -= m_addedcols;
   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed "
                 << this->m_remRows << " rows, "
                 << this->m_remCols << " columns, "
                 << this->m_remNzos << " nonzeros, "
                 << this->m_chgBnds << " col bounds, "
                 << this->m_chgLRhs << " row bounds"
                 << std::endl;)

   if(keepbounds)
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier kept "
                    << this->m_keptBnds << " column bounds, "
                    << this->m_keptLRhs << " row bounds"
                    << std::endl;)

      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Reduced LP has "
                    << lp.nRows() << " rows "
                    << lp.nCols() << " columns "
                    << lp.nNzos() << " nonzeros"
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout),
                    int numRangedRows = 0;
                    int numBoxedCols  = 0;
                    int numEqualities = 0;

                    for(int i = 0; i < lp.nRows(); ++i)
   {
      if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
         {
            if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
               ++numEqualities;
            else
               ++numRangedRows;
         }
      }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "Reduced LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         if(lp.nCols() == 0 && lp.nRows() == 0)
         {
            SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed all rows and columns" <<
                          std::endl;)
            m_result = this->VANISHED;
         }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "\nSimplifier performed:\n"
                 << m_stat[EMPTY_ROW]            << " empty rows\n"
                 << m_stat[FREE_ROW]             << " free rows\n"
                 << m_stat[SINGLETON_ROW]        << " singleton rows\n"
                 << m_stat[FORCE_ROW]            << " forcing rows\n"
                 << m_stat[EMPTY_COL]            << " empty columns\n"
                 << m_stat[FIX_COL]              << " fixed columns\n"
                 << m_stat[FREE_ZOBJ_COL]        << " free columns with zero objective\n"
                 << m_stat[ZOBJ_SINGLETON_COL]   << " singleton columns with zero objective\n"
                 << m_stat[DOUBLETON_ROW]        << " singleton columns combined with a doubleton equation\n"
                 << m_stat[FREE_SINGLETON_COL]   << " free singleton columns\n"
                 << m_stat[DOMINATED_COL]        << " dominated columns\n"
                 << m_stat[WEAKLY_DOMINATED_COL] << " weakly dominated columns\n"
                 << m_stat[DUPLICATE_ROW]        << " duplicate rows\n"
                 << m_stat[FIX_DUPLICATE_COL]    << " duplicate columns (fixed)\n"
                 << m_stat[SUB_DUPLICATE_COL]    << " duplicate columns (substituted)\n"
                 << m_stat[AGGREGATION]          << " variable aggregations\n"
                 << m_stat[MULTI_AGG]            << " multi aggregations\n"
                 << std::endl;);

   this->m_timeUsed->stop();

   return m_result;
}